

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O1

int __thiscall llama_context::encode(llama_context *this,llama_batch *inp_batch)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  uint uVar3;
  llama_model *plVar4;
  pointer piVar5;
  _Base_ptr p_Var6;
  long lVar7;
  pointer __dest;
  float *__src;
  llama_batch in_batch;
  undefined1 auVar8 [16];
  llama_pos lVar9;
  uint32_t uVar10;
  int32_t iVar11;
  ggml_status gVar12;
  int64_t iVar13;
  llama_ubatch *ubatch_00;
  long lVar14;
  mapped_type *pmVar15;
  size_t __n;
  _Base_ptr p_Var16;
  char *pcVar17;
  ulong uVar18;
  _Rb_tree_header *p_Var19;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  *this_00;
  int iVar20;
  undefined8 uVar21;
  ulong uVar22;
  ulong uVar23;
  size_type n_ubatch;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  llama_seq_id seq_id;
  llm_graph_result_ptr res;
  llama_ubatch ubatch;
  llama_batch_allocr batch_allocr;
  int local_174;
  undefined1 local_170 [32];
  long local_150;
  uint32_t local_148;
  float fStack_144;
  llama_token *plStack_140;
  float *local_138;
  llama_pos *plStack_130;
  int32_t *local_128;
  llama_seq_id **pplStack_120;
  int8_t *local_118;
  llama_ubatch local_110;
  llama_batch_allocr local_d0;
  
  if (inp_batch->n_tokens == 0) {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: n_tokens == 0\n","encode");
    return -1;
  }
  local_118 = inp_batch->logits;
  local_148 = inp_batch->n_tokens;
  fStack_144 = *(float *)&inp_batch->field_0x4;
  plStack_140 = inp_batch->token;
  local_138 = inp_batch->embd;
  plStack_130 = inp_batch->pos;
  local_128 = inp_batch->n_seq_id;
  pplStack_120 = inp_batch->seq_id;
  lVar9 = -1;
  if (inp_batch->pos == (llama_pos *)0x0) {
    lVar9 = llama_kv_cache_unified::pos_max
                      ((this->kv_self)._M_t.
                       super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                       .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl);
    lVar9 = lVar9 + 1;
  }
  in_batch.token = plStack_140;
  in_batch.n_tokens = local_148;
  in_batch._4_4_ = fStack_144;
  in_batch.embd = local_138;
  in_batch.pos = plStack_130;
  in_batch.n_seq_id = local_128;
  in_batch.seq_id = pplStack_120;
  in_batch.logits = local_118;
  llama_batch_allocr::llama_batch_allocr(&local_d0,in_batch,lVar9);
  if (((__buckets_ptr)local_d0.batch.embd == (__buckets_ptr)0x0) ==
      ((pointer)local_d0.batch.token == (pointer)0x0)) {
    pcVar17 = "(!batch.token && batch.embd) || (batch.token && !batch.embd)";
    uVar21 = 0x40f;
LAB_0018f3c5:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
               ,uVar21,"GGML_ASSERT(%s) failed",pcVar17);
  }
  uVar22 = (ulong)(uint)local_d0.batch.n_tokens;
  plVar4 = this->model;
  if (0 < local_d0.batch.n_tokens && (pointer)local_d0.batch.token != (pointer)0x0) {
    uVar23 = 0;
    do {
      uVar3 = *(uint *)((long)local_d0.batch.token + uVar23 * 4);
      if (((int)uVar3 < 0) || (uVar10 = llama_vocab::n_tokens(&this->model->vocab), uVar10 <= uVar3)
         ) {
        iVar20 = -1;
        llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: invalid token[%d] = %d\n","encode",
                           uVar23 & 0xffffffff,
                           (ulong)*(uint *)((long)local_d0.batch.token + uVar23 * 4));
        goto LAB_0018f323;
      }
      uVar23 = uVar23 + 1;
    } while (uVar22 != uVar23);
  }
  if ((this->cparams).n_ubatch < (uint)local_d0.batch.n_tokens) {
    pcVar17 = "cparams.n_ubatch >= (uint32_t) n_tokens && \"encoder requires n_ubatch >= n_tokens\""
    ;
    uVar21 = 0x41b;
    goto LAB_0018f3c5;
  }
  if (this->t_compute_start_us == 0) {
    iVar13 = ggml_time_us();
    this->t_compute_start_us = iVar13;
  }
  n_ubatch = (size_type)local_d0.batch.n_tokens;
  this->n_queued_tokens = this->n_queued_tokens + n_ubatch;
  uVar23 = (ulong)(plVar4->hparams).n_embd;
  llama_sbatch::from_batch(&this->sbatch,&local_d0.batch,uVar23,true,true);
  llama_sbatch::split_simple(&local_110,&this->sbatch,n_ubatch);
  iVar11 = output_reserve(this,local_d0.batch.n_tokens);
  auVar8 = _DAT_002360d0;
  if (iVar11 < local_d0.batch.n_tokens) {
    iVar20 = -2;
    llama_log_internal(GGML_LOG_LEVEL_ERROR,
                       "%s: could not reserve space for batch with %u outputs\n","encode",
                       (ulong)(uint)local_d0.batch.n_tokens);
    goto LAB_0018f323;
  }
  if (0 < local_d0.batch.n_tokens) {
    piVar5 = (this->output_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar14 = uVar22 - 1;
    auVar24._8_4_ = (int)lVar14;
    auVar24._0_8_ = lVar14;
    auVar24._12_4_ = (int)((ulong)lVar14 >> 0x20);
    uVar18 = 0;
    auVar24 = auVar24 ^ _DAT_002360d0;
    auVar25 = _DAT_002360c0;
    do {
      auVar26 = auVar25 ^ auVar8;
      if ((bool)(~(auVar26._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar26._0_4_ ||
                  auVar24._4_4_ < auVar26._4_4_) & 1)) {
        piVar5[uVar18] = (int)uVar18;
      }
      if ((auVar26._12_4_ != auVar24._12_4_ || auVar26._8_4_ <= auVar24._8_4_) &&
          auVar26._12_4_ <= auVar24._12_4_) {
        piVar5[uVar18 + 1] = (int)uVar18 + 1;
      }
      uVar18 = uVar18 + 2;
      lVar14 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 2;
      auVar25._8_8_ = lVar14 + 2;
    } while ((local_d0.batch.n_tokens + 1U & 0xfffffffe) != uVar18);
  }
  this->n_outputs = local_d0.batch.n_tokens;
  ggml_backend_sched_reset
            ((this->sched)._M_t.
             super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
             super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
             super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
  ggml_backend_sched_set_eval_callback
            ((this->sched)._M_t.
             super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
             super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
             super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,(this->cparams).cb_eval
             ,(this->cparams).cb_eval_user_data);
  bVar2 = (this->cparams).causal_attn;
  (this->cparams).causal_attn = false;
  ubatch_00 = (llama_ubatch *)graph_init(this);
  graph_build((llama_context *)local_170,(ggml_context *)this,
              (ggml_cgraph *)
              (this->ctx_compute)._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
              _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,ubatch_00,
              (llm_graph_type)&local_110);
  ggml_backend_sched_alloc_graph
            ((this->sched)._M_t.
             super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
             super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
             super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,ubatch_00);
  (**(code **)(*(long *)local_170._0_8_ + 0x28))(local_170._0_8_,&local_110);
  (this->cparams).causal_attn = bVar2;
  gVar12 = graph_compute(this,(ggml_cgraph *)ubatch_00,1 < local_d0.batch.n_tokens);
  if (gVar12 == GGML_STATUS_ALLOC_FAILED) {
    iVar20 = -2;
    goto LAB_0018f313;
  }
  if (gVar12 != GGML_STATUS_SUCCESS) {
    iVar20 = 2;
    if (gVar12 != GGML_STATUS_ABORTED) {
      iVar20 = -3;
    }
    goto LAB_0018f313;
  }
  lVar14 = (**(code **)(*(long *)local_170._0_8_ + 0x20))();
  local_170._8_8_ = (**(code **)(*(long *)local_170._0_8_ + 0x18 + (ulong)(lVar14 != 0) * 8))();
  if (local_170._8_8_ == 0) goto switchD_0018f0f9_default;
  local_170._16_8_ =
       ggml_backend_sched_get_tensor_backend
                 ((this->sched)._M_t.
                  super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                  super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                  super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,local_170._8_8_);
  if (local_170._16_8_ == 0) {
    pcVar17 = "backend_embd != nullptr";
    uVar21 = 0x45c;
LAB_0018f3f4:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
               ,uVar21,"GGML_ASSERT(%s) failed",pcVar17);
  }
  if (this->embd == (float *)0x0) {
    pcVar17 = "embd != nullptr";
    uVar21 = 0x45e;
    goto LAB_0018f3f4;
  }
  switch((this->cparams).pooling_type) {
  case LLAMA_POOLING_TYPE_NONE:
    lVar14 = uVar23 * n_ubatch;
    if (lVar14 - this->embd_size != 0 && (long)this->embd_size <= lVar14) {
      pcVar17 = "n_tokens*n_embd <= (int64_t) embd_size";
      uVar21 = 0x464;
      goto LAB_0018f3f4;
    }
    ggml_backend_tensor_get_async(local_170._16_8_,local_170._8_8_,this->embd,0,lVar14 * 4);
    break;
  case LLAMA_POOLING_TYPE_MEAN:
  case LLAMA_POOLING_TYPE_CLS:
  case LLAMA_POOLING_TYPE_LAST:
    local_170._24_8_ = &this->embd_seq;
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
    ::clear((_Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
             *)local_170._24_8_);
    if (local_110.equal_seqs != false) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                 ,0x46f,"GGML_ASSERT(%s) failed","!ubatch.equal_seqs");
    }
    if (0 < local_d0.batch.n_tokens) {
      p_Var1 = &(this->embd_seq)._M_t._M_impl.super__Rb_tree_header;
      local_150 = uVar23 * 4;
      uVar18 = 0;
      do {
        local_174 = *(int *)(((pointer)(local_110.seq_id + uVar18))->_M_t).
                            super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>.
                            _M_t.
                            super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>
                            .super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl;
        p_Var6 = (this->embd_seq)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var16 = &p_Var1->_M_header;
        for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
            p_Var6 = (&p_Var6->_M_left)[(int)*(size_t *)(p_Var6 + 1) < local_174]) {
          if (local_174 <= (int)*(size_t *)(p_Var6 + 1)) {
            p_Var16 = p_Var6;
          }
        }
        p_Var19 = p_Var1;
        if (((_Rb_tree_header *)p_Var16 != p_Var1) &&
           (p_Var19 = (_Rb_tree_header *)p_Var16,
           local_174 < (int)((_Rb_tree_header *)p_Var16)->_M_node_count)) {
          p_Var19 = p_Var1;
        }
        if (p_Var19 == p_Var1) {
          pmVar15 = std::
                    map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                    ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                  *)local_170._24_8_,&local_174);
          std::vector<float,_std::allocator<float>_>::resize(pmVar15,uVar23);
          pmVar15 = std::
                    map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                    ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                  *)local_170._24_8_,&local_174);
          ggml_backend_tensor_get_async
                    (local_170._16_8_,local_170._8_8_,
                     (pmVar15->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start,local_174 * local_150);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != uVar22);
    }
    break;
  case LLAMA_POOLING_TYPE_RANK:
    pcVar17 = "RANK pooling not implemented yet";
    uVar21 = 0x47f;
LAB_0018f444:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
               ,uVar21,pcVar17);
  case LLAMA_POOLING_TYPE_UNSPECIFIED:
    pcVar17 = "unknown pooling type";
    uVar21 = 0x483;
    goto LAB_0018f444;
  }
switchD_0018f0f9_default:
  ggml_backend_sched_reset
            ((this->sched)._M_t.
             super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
             super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
             super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
  uVar21 = local_170._8_8_;
  iVar20 = 0;
  if ((local_170._8_8_ != 0) && (this->model->arch == LLM_ARCH_T5)) {
    synchronize(this);
    lVar14 = *(long *)(uVar21 + 0x10);
    (this->cross).n_embd = lVar14;
    lVar7 = *(long *)(uVar21 + 0x18);
    (this->cross).n_enc = lVar7;
    std::vector<float,_std::allocator<float>_>::resize(&(this->cross).v_embd,lVar7 * lVar14);
    __dest = (this->cross).v_embd.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    __src = this->embd;
    __n = ggml_nbytes(uVar21);
    memcpy(__dest,__src,__n);
    this_00 = &(this->cross).seq_ids_enc;
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::resize(this_00,n_ubatch);
    if (0 < local_d0.batch.n_tokens) {
      uVar23 = 0;
      do {
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                  (&(this_00->
                    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar23]._M_t);
        if (0 < *(int *)((long)&(((__uniq_ptr_data<ggml_backend_buffer,_ggml_backend_buffer_deleter,_true,_true>
                                   *)local_110.n_seq_id)->
                                super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>
                                )._M_t.
                                super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>
                                .super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl +
                        uVar23 * 4)) {
          lVar14 = 0;
          do {
            local_174 = *(int *)((((pointer)(local_110.seq_id + uVar23))->_M_t).
                                 super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>
                                 .super__Head_base<0UL,_ggml_backend_buffer_*,_false>._M_head_impl +
                                lVar14 * 4);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       ((this_00->
                        super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar23),&local_174);
            lVar14 = lVar14 + 1;
          } while (lVar14 < *(int *)((long)&(((__uniq_ptr_data<ggml_backend_buffer,_ggml_backend_buffer_deleter,_true,_true>
                                               *)local_110.n_seq_id)->
                                            super___uniq_ptr_impl<ggml_backend_buffer,_ggml_backend_buffer_deleter>
                                            )._M_t.
                                            super__Tuple_impl<0UL,_ggml_backend_buffer_*,_ggml_backend_buffer_deleter>
                                            .super__Head_base<0UL,_ggml_backend_buffer_*,_false>.
                                            _M_head_impl + uVar23 * 4));
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 != uVar22);
      iVar20 = 0;
    }
  }
LAB_0018f313:
  if ((llama_model *)local_170._0_8_ != (llama_model *)0x0) {
    (**(code **)(*(long *)local_170._0_8_ + 8))();
  }
LAB_0018f323:
  if ((pointer)local_d0.logits.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
               .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.logits.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.logits.
                          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.logits.
                          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d0.seq_id.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.seq_id.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.seq_id.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.seq_id.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d0.n_seq_id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.n_seq_id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.n_seq_id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.n_seq_id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((__node_base_ptr)
      local_d0.pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (__node_base_ptr)0x0) {
    operator_delete(local_d0.pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar20;
}

Assistant:

int llama_context::encode(llama_batch & inp_batch) {
    if (inp_batch.n_tokens == 0) {
        LLAMA_LOG_ERROR("%s: n_tokens == 0\n", __func__);
        return -1;
    }

    // temporary allocate memory for the input batch if needed
    // TODO: this is incorrect for multiple sequences because pos_max() is the maximum across all sequences
    llama_batch_allocr batch_allocr(inp_batch, inp_batch.pos ? -1 : kv_self->pos_max() + 1);

    const llama_batch & batch = batch_allocr.batch;
    const int32_t n_tokens = batch.n_tokens;

    const auto & hparams = model.hparams;

    GGML_ASSERT((!batch.token && batch.embd) || (batch.token && !batch.embd)); // NOLINT

    if (batch.token) {
        for (int32_t i = 0; i < n_tokens; ++i) {
            if (batch.token[i] < 0 || (uint32_t) batch.token[i] >= model.vocab.n_tokens()) {
                LLAMA_LOG_ERROR("%s: invalid token[%d] = %d\n", __func__, i, batch.token[i]);
                return -1;
            }
        }
    }

    // micro-batching is not possible for non-causal encoding, so we process the batch in a single shot
    GGML_ASSERT(cparams.n_ubatch >= (uint32_t) n_tokens && "encoder requires n_ubatch >= n_tokens");

    if (t_compute_start_us == 0) {
        t_compute_start_us = ggml_time_us();
    }

    n_queued_tokens += n_tokens;

    const int64_t n_embd = hparams.n_embd;

    sbatch.from_batch(batch, n_embd, /* simple_split */ true, /* logits_all */ true);

    const llama_ubatch ubatch = sbatch.split_simple(n_tokens);

    // reserve output buffer
    if (output_reserve(n_tokens) < n_tokens) {
        LLAMA_LOG_ERROR("%s: could not reserve space for batch with %u outputs\n", __func__, n_tokens);
        return -2;
    };

    for (int32_t i = 0; i < n_tokens; ++i) {
        output_ids[i] = i;
    }

    n_outputs = n_tokens;

    //batch_manager->prepare(ubatch);

    ggml_backend_sched_reset(sched.get());
    ggml_backend_sched_set_eval_callback(sched.get(), cparams.cb_eval, cparams.cb_eval_user_data);

    const auto causal_attn_org = cparams.causal_attn;

    // always use non-causal attention for encoder graphs
    // TODO: this is a tmp solution until we have a proper way to support enc-dec models
    //       ref: https://github.com/ggml-org/llama.cpp/pull/12181#issuecomment-2730451223
    cparams.causal_attn = false;

    auto * gf = graph_init();
    auto res = graph_build(ctx_compute.get(), gf, ubatch, LLM_GRAPH_TYPE_ENCODER);

    ggml_backend_sched_alloc_graph(sched.get(), gf);

    res->set_inputs(&ubatch);

    cparams.causal_attn = causal_attn_org;

    const auto compute_status = graph_compute(gf, n_tokens > 1);
    switch (compute_status) {
        case GGML_STATUS_SUCCESS:
            break;
        case GGML_STATUS_ABORTED:
            return 2;
        case GGML_STATUS_ALLOC_FAILED:
            return -2;
        case GGML_STATUS_FAILED:
        default:
            return -3;
    }

    auto * t_embd = res->get_embd_pooled() ? res->get_embd_pooled() : res->get_embd();

    // extract embeddings
    if (t_embd) {
        ggml_backend_t backend_embd = ggml_backend_sched_get_tensor_backend(sched.get(), t_embd);
        GGML_ASSERT(backend_embd != nullptr);

        GGML_ASSERT(embd != nullptr);

        switch (cparams.pooling_type) {
            case LLAMA_POOLING_TYPE_NONE:
                {
                    // extract token embeddings
                    GGML_ASSERT(n_tokens*n_embd <= (int64_t) embd_size);
                    ggml_backend_tensor_get_async(backend_embd, t_embd, embd, 0, n_tokens*n_embd*sizeof(float));
                } break;
            case LLAMA_POOLING_TYPE_MEAN:
            case LLAMA_POOLING_TYPE_CLS:
            case LLAMA_POOLING_TYPE_LAST:
                {
                    // extract sequence embeddings
                    auto & embd_seq_out = embd_seq;
                    embd_seq_out.clear();

                    GGML_ASSERT(!ubatch.equal_seqs); // TODO: handle equal splits

                    for (int32_t i = 0; i < n_tokens; i++) {
                        const llama_seq_id seq_id = ubatch.seq_id[i][0];
                        if (embd_seq_out.find(seq_id) != embd_seq_out.end()) {
                            continue;
                        }
                        embd_seq_out[seq_id].resize(n_embd);
                        ggml_backend_tensor_get_async(backend_embd, t_embd, embd_seq_out[seq_id].data(), (n_embd*seq_id)*sizeof(float), n_embd*sizeof(float));
                    }
                } break;
            case LLAMA_POOLING_TYPE_RANK:
                {
                    // TODO: this likely should be the same logic as in llama_decoder_internal, but better to
                    //       wait for an encoder model that requires this pooling type in order to test it
                    //       https://github.com/ggerganov/llama.cpp/pull/9510
                    GGML_ABORT("RANK pooling not implemented yet");
                }
            case LLAMA_POOLING_TYPE_UNSPECIFIED:
                {
                    GGML_ABORT("unknown pooling type");
                }
        }
    }

    // Reset state for the next token before backend sync, to allow the CPU activities in the reset to
    // overlap with device computation.
    ggml_backend_sched_reset(sched.get());

    // TODO: hacky solution
    if (model.arch == LLM_ARCH_T5 && t_embd) {
        //cross.t_embd = t_embd;

        synchronize();

        cross.n_embd = t_embd->ne[0];
        cross.n_enc  = t_embd->ne[1];
        cross.v_embd.resize(cross.n_embd*cross.n_enc);
        memcpy(cross.v_embd.data(), embd, ggml_nbytes(t_embd));

        // remember the sequence ids used during the encoding - needed for cross attention later
        cross.seq_ids_enc.resize(n_tokens);
        for (int32_t i = 0; i < n_tokens; i++) {
            cross.seq_ids_enc[i].clear();
            for (int s = 0; s < ubatch.n_seq_id[i]; s++) {
                llama_seq_id seq_id = ubatch.seq_id[i][s];
                cross.seq_ids_enc[i].insert(seq_id);
            }
        }
    }

    return 0;
}